

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtestPlatformTest.cpp
# Opt level: O0

void __thiscall
TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToForkFailedInSeparateProcessWorks_Test
::testBody(TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToForkFailedInSeparateProcessWorks_Test
           *this)

{
  TestTestingFixture *this_00;
  SimpleString local_40 [2];
  SimpleString local_20;
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToForkFailedInSeparateProcessWorks_Test
  *local_10;
  TEST_UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess_CallToForkFailedInSeparateProcessWorks_Test
  *this_local;
  
  local_10 = this;
  CppUTestStore(&PlatformSpecificFork);
  PlatformSpecificFork = fork_failed_stub;
  this_00 = &(this->
             super_TEST_GROUP_CppUTestGroupUTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess
             ).fixture;
  TestTestingFixture::setRunTestsInSeperateProcess(this_00);
  TestTestingFixture::runAllTests(this_00);
  SimpleString::SimpleString(&local_20,"Call to fork() failed");
  TestTestingFixture::assertPrintContains(this_00,&local_20);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(local_40,"Errors (1 failures, 1 tests, 1 ran");
  TestTestingFixture::assertPrintContains
            (&(this->
              super_TEST_GROUP_CppUTestGroupUTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess
              ).fixture,local_40);
  SimpleString::~SimpleString(local_40);
  return;
}

Assistant:

TEST(UTestPlatformsTest_PlatformSpecificRunTestInASeperateProcess, CallToForkFailedInSeparateProcessWorks)
{
    UT_PTR_SET(PlatformSpecificFork, fork_failed_stub);
    fixture.setRunTestsInSeperateProcess();
    fixture.runAllTests();
    fixture.assertPrintContains("Call to fork() failed");
    fixture.assertPrintContains("Errors (1 failures, 1 tests, 1 ran");
}